

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool __thiscall App::get_output_filename(App *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  DynamicFormat *pDVar2;
  size_type __n;
  long *plVar3;
  long lVar4;
  string_view name;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 auVar5 [16];
  string guessed_output_name;
  string results;
  string extension;
  allocator_type local_1f9;
  file_dialog local_1f8;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  long *local_70 [2];
  long local_60 [6];
  
  auVar5 = (**(code **)(*(long *)this->input_format + 8))();
  name._M_str = auVar5._8_8_;
  name._M_len = (size_t)name._M_str;
  pDVar2 = ritobin::io::DynamicFormat::get(auVar5._0_8_,name);
  paVar1 = &local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  if (pDVar2 != (DynamicFormat *)0x0) {
    auVar5 = (**(code **)(*(long *)pDVar2 + 0x10))(pDVar2);
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,auVar5._8_8_,auVar5._0_8_ + auVar5._8_8_);
    if (local_150._M_string_length != 0) {
      __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_last_of(&this->input_filename,".",0xffffffffffffffff,1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_170,&this->input_filename,0,__n);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_170,local_150._M_dataplus._M_p,local_150._M_string_length);
      get_output_filename();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
  }
  printf("Guessed name: %s\n",local_1e8._M_dataplus._M_p);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"ritobin output file","");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"All Files","");
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"*","");
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"bin files","");
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"*.bin","");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"text files","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"*.txt *.py","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"json files","");
  plVar3 = local_60;
  local_70[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"*.json","");
  __l._M_len = 8;
  __l._M_array = &local_150;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_188,__l,&local_1f9);
  pfd::internal::file_dialog::file_dialog
            (&local_1f8,save,&local_1c8,&local_1e8,&local_188,force_overwrite);
  pfd::internal::file_dialog::string_result_abi_cxx11_(&local_1a8,&local_1f8);
  if (local_1f8.super_dialog.m_async.
      super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super_dialog.m_async.
               super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  lVar4 = -0x100;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_1a8._M_string_length == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&this->output_filename,0,(this->output_filename)._M_string_length,"",0);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->output_filename,&local_1a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
  return local_1a8._M_string_length != 0;
}

Assistant:

bool get_output_filename() {
        DynamicFormat const* guessed_output_format = DynamicFormat::get(input_format->oposite_name());
        std::string guessed_output_name = {};
        if (guessed_output_format) {
            std::string extension = std::string(guessed_output_format->default_extension());
            if (!extension.empty()) {
                auto const dot = input_filename.find_last_of(".");
                guessed_output_name = input_filename.substr(0, dot) + extension;
            }
        }
        printf("Guessed name: %s\n", guessed_output_name.c_str());
        auto results = pfd::save_file("ritobin output file", guessed_output_name,
                                      {
                                          "All Files", "*",
                                          "bin files", "*.bin",
                                          "text files", "*.txt *.py",
                                          "json files", "*.json",
                                      }, pfd::opt::force_overwrite).result();
        if (results.empty()) {
            output_filename = "";
            return false;
        }
        output_filename = std::move(results);
        return true;
    }